

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_catalog_set.hpp
# Opt level: O3

void __thiscall
duckdb::DependencyCatalogSet::DependencyCatalogSet
          (DependencyCatalogSet *this,CatalogSet *set,CatalogEntryInfo *info)

{
  pointer pcVar1;
  
  this->set = set;
  (this->info).type = info->type;
  (this->info).schema._M_dataplus._M_p = (pointer)&(this->info).schema.field_2;
  pcVar1 = (info->schema)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->info).schema,pcVar1,pcVar1 + (info->schema)._M_string_length);
  (this->info).name._M_dataplus._M_p = (pointer)&(this->info).name.field_2;
  pcVar1 = (info->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->info).name,pcVar1,pcVar1 + (info->name)._M_string_length);
  MangledEntryName::MangledEntryName(&this->mangled_name,info);
  return;
}

Assistant:

DependencyCatalogSet(CatalogSet &set, const CatalogEntryInfo &info)
	    : set(set), info(info), mangled_name(DependencyManager::MangleName(info)) {
	}